

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O1

bool __thiscall sptk::Matrix::Transpose(Matrix *this,Matrix *transposed_matrix)

{
  int iVar1;
  uint uVar2;
  pointer ppdVar3;
  double *pdVar4;
  long lVar5;
  ulong uVar6;
  
  if (this != transposed_matrix && transposed_matrix != (Matrix *)0x0) {
    if ((transposed_matrix->num_row_ != this->num_column_) ||
       (transposed_matrix->num_column_ != this->num_row_)) {
      Resize(transposed_matrix,this->num_column_,this->num_row_);
    }
    iVar1 = this->num_column_;
    if (0 < (long)iVar1) {
      uVar2 = this->num_row_;
      ppdVar3 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar5 = 0;
      do {
        if (0 < (int)uVar2) {
          pdVar4 = (transposed_matrix->index_).
                   super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar5];
          uVar6 = 0;
          do {
            pdVar4[uVar6] = ppdVar3[uVar6][lVar5];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != iVar1);
    }
  }
  return this != transposed_matrix && transposed_matrix != (Matrix *)0x0;
}

Assistant:

bool Matrix::Transpose(Matrix* transposed_matrix) const {
  if (NULL == transposed_matrix || this == transposed_matrix) {
    return false;
  }

  if (transposed_matrix->num_row_ != num_column_ ||
      transposed_matrix->num_column_ != num_row_) {
    transposed_matrix->Resize(num_column_, num_row_);
  }

  for (int i(0); i < num_column_; ++i) {
    for (int j(0); j < num_row_; ++j) {
      transposed_matrix->index_[i][j] = index_[j][i];
    }
  }

  return true;
}